

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_uint * nk_find_value(nk_window *win,nk_hash name)

{
  long lVar1;
  nk_uint *in_RAX;
  nk_table *pnVar2;
  ushort uVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  
  uVar3 = win->table_size;
  pnVar2 = win->tables;
  do {
    if (pnVar2 == (nk_table *)0x0) {
      return (nk_uint *)0x0;
    }
    bVar6 = uVar3 != 0;
    if (uVar3 == 0) {
LAB_0013722c:
      pnVar2 = pnVar2->next;
      uVar3 = 0x35;
    }
    else {
      if (pnVar2->keys[0] == name) {
        lVar4 = 0;
      }
      else {
        lVar5 = 0;
        do {
          if ((ushort)(uVar3 - 1) == (short)lVar5) {
            bVar6 = false;
            goto LAB_0013722c;
          }
          lVar4 = lVar5 + 1;
          lVar1 = lVar5 + 1;
          lVar5 = lVar4;
        } while (pnVar2->keys[lVar1] != name);
        bVar6 = (ushort)lVar4 < uVar3;
      }
      pnVar2->seq = win->seq;
      in_RAX = pnVar2->values + lVar4;
    }
    if (bVar6) {
      return in_RAX;
    }
  } while( true );
}

Assistant:

NK_INTERN nk_uint*
nk_find_value(struct nk_window *win, nk_hash name)
{
    nk_ushort size = win->table_size;
    struct nk_table *iter = win->tables;
    while (iter) {
        nk_ushort i = 0;
        for (i = 0; i < size; ++i) {
            if (iter->keys[i] == name) {
                iter->seq = win->seq;
                return &iter->values[i];
            }
        }
        size = NK_VALUE_PAGE_CAPACITY;
        iter = iter->next;
    }
    return 0;
}